

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_append_Test::~Test_aistr_append_Test(Test_aistr_append_Test *this)

{
  Test_aistr_append_Test *this_local;
  
  ~Test_aistr_append_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(Test_aistr, append) {
    char buf[10] = {0};

    EXPECT_THROW(ai::append(buf, nullptr), std::invalid_argument);

    ai::append(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "5678");
    ASSERT_EQ(ai::compare(buf, "12345678"), 0);

    ai::append(buf, "9");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::append(buf, "01");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}